

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O2

void test_decimal128_from_string__nan(void)

{
  undefined8 uVar1;
  bson_decimal128_t dec;
  undefined1 local_20 [8];
  long local_18;
  
  bson_decimal128_from_string("NaN",local_20);
  if (local_18 == 0x7c00000000000000) {
    bson_decimal128_from_string("+NaN",local_20);
    if (local_18 == 0x7c00000000000000) {
      bson_decimal128_from_string("-NaN",local_20);
      if (local_18 == 0x7c00000000000000) {
        bson_decimal128_from_string("-nan",local_20);
        if (local_18 == 0x7c00000000000000) {
          bson_decimal128_from_string("1e",local_20);
          if (local_18 == 0x7c00000000000000) {
            bson_decimal128_from_string("+nan",local_20);
            if (local_18 == 0x7c00000000000000) {
              bson_decimal128_from_string("nan",local_20);
              if (local_18 == 0x7c00000000000000) {
                bson_decimal128_from_string("Nan",local_20);
                if (local_18 == 0x7c00000000000000) {
                  bson_decimal128_from_string("+Nan",local_20);
                  if (local_18 == 0x7c00000000000000) {
                    bson_decimal128_from_string("-Nan",local_20);
                    if (local_18 == 0x7c00000000000000) {
                      return;
                    }
                    uVar1 = 0x14a;
                  }
                  else {
                    uVar1 = 0x148;
                  }
                }
                else {
                  uVar1 = 0x146;
                }
              }
              else {
                uVar1 = 0x144;
              }
            }
            else {
              uVar1 = 0x142;
            }
          }
          else {
            uVar1 = 0x140;
          }
        }
        else {
          uVar1 = 0x13e;
        }
      }
      else {
        uVar1 = 0x13c;
      }
    }
    else {
      uVar1 = 0x13a;
    }
  }
  else {
    uVar1 = 0x138;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
          ,uVar1,"test_decimal128_from_string__nan","IS_NAN (dec)");
  abort();
}

Assistant:

static void
test_decimal128_from_string__nan (void)
{
   bson_decimal128_t dec;

   bson_decimal128_from_string ("NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1e", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
}